

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::IfConversion::CanHoistInstruction
          (IfConversion *this,Instruction *inst,BasicBlock *target_block,
          DominatorAnalysis *dominators)

{
  Instruction *pIVar1;
  IRContext *this_00;
  DefUseManager *pDVar2;
  pointer pOVar3;
  uint **ppuVar4;
  bool bVar5;
  char cVar6;
  uint32_t a;
  uint32_t b;
  BasicBlock *pBVar7;
  uint **ppuVar8;
  pointer pOVar9;
  undefined8 *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  DominatorTree *local_40;
  uint *local_38;
  
  pBVar7 = IRContext::get_instr_block((this->super_Pass).context_,inst);
  bVar5 = true;
  if (pBVar7 != (BasicBlock *)0x0) {
    if (target_block != (BasicBlock *)0x0) {
      pIVar1 = (pBVar7->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      b = 0;
      a = 0;
      local_40 = (DominatorTree *)dominators;
      if (pIVar1->has_result_id_ == true) {
        a = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      pIVar1 = (target_block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar1->has_result_id_ == true) {
        b = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      dominators = (DominatorAnalysis *)local_40;
      bVar5 = DominatorTree::Dominates(local_40,a,b);
      if (bVar5) {
        return true;
      }
    }
    bVar5 = Instruction::IsOpcodeCodeMotionSafe(inst);
    if (bVar5) {
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      pDVar2 = (this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      local_58 = 0;
      local_60 = (undefined8 *)operator_new(0x20);
      *local_60 = this;
      local_60[1] = target_block;
      local_60[2] = pDVar2;
      local_60[3] = dominators;
      local_48 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:290:7)>
                 ::_M_invoke;
      local_50 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:290:7)>
                 ::_M_manager;
      pOVar9 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pOVar3 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pOVar9 == pOVar3) {
        bVar5 = true;
      }
      else {
        do {
          bVar5 = spvIsInIdType(pOVar9->type);
          if (bVar5) {
            ppuVar4 = (uint **)(pOVar9->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar8 = &(pOVar9->words).small_data_;
            if (ppuVar4 != (uint **)0x0) {
              ppuVar8 = ppuVar4;
            }
            local_38 = *ppuVar8;
            if (local_50 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar6 = (*local_48)(&local_60,&local_38);
            if (cVar6 == '\0') {
              bVar5 = false;
              goto LAB_0021ade6;
            }
          }
          pOVar9 = pOVar9 + 1;
        } while (pOVar9 != pOVar3);
        bVar5 = true;
LAB_0021ade6:
        if (local_50 == (code *)0x0) {
          return bVar5;
        }
      }
      (*local_50)(&local_60,&local_60,3);
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool IfConversion::CanHoistInstruction(Instruction* inst,
                                       BasicBlock* target_block,
                                       DominatorAnalysis* dominators) {
  BasicBlock* inst_block = context()->get_instr_block(inst);
  if (!inst_block) {
    // This is in the header, and dominates everything.
    return true;
  }

  if (dominators->Dominates(inst_block, target_block)) {
    // Already in position.  No work to do.
    return true;
  }

  if (!inst->IsOpcodeCodeMotionSafe()) {
    return false;
  }

  // Check all instruction |inst| depends on.
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  return inst->WhileEachInId(
      [this, target_block, def_use_mgr, dominators](uint32_t* id) {
        Instruction* operand_inst = def_use_mgr->GetDef(*id);
        return CanHoistInstruction(operand_inst, target_block, dominators);
      });
}